

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network_color_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::CurveNetworkNodeColorQuantity::CurveNetworkNodeColorQuantity
          (CurveNetworkNodeColorQuantity *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *values_,CurveNetwork *network_)

{
  string *in_RSI;
  undefined8 *in_RDI;
  allocator local_61;
  string local_60 [16];
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  CurveNetwork *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  CurveNetworkColorQuantity *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"node",&local_61);
  CurveNetworkColorQuantity::CurveNetworkColorQuantity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  *in_RDI = &PTR__CurveNetworkNodeColorQuantity_0098e0a0;
  return;
}

Assistant:

CurveNetworkNodeColorQuantity::CurveNetworkNodeColorQuantity(std::string name, std::vector<glm::vec3> values_,
                                                             CurveNetwork& network_)
    : CurveNetworkColorQuantity(name, network_, "node", values_) {}